

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_1::BasicResetCase::provokeReset
          (BasicResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ostringstream *this_00;
  undefined1 local_190 [384];
  
  local_190._0_8_ =
       ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Check the graphics reset status returned by glGetGraphicsResetStatus() equals ",0x4e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"GL_GUILTY_CONTEXT_RESET after a context reset\n\n",0x2f);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  (*contextReset->m_ptr->_vptr_ContextReset[2])();
  (*contextReset->m_ptr->_vptr_ContextReset[3])();
  return;
}

Assistant:

virtual void provokeReset (de::SharedPtr<ContextReset>& contextReset)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Check the graphics reset status returned by glGetGraphicsResetStatus() equals "
							<< "GL_GUILTY_CONTEXT_RESET after a context reset\n\n"
							<< tcu::TestLog::EndMessage;

		contextReset->setup();
		contextReset->draw();
	}